

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

void xmlTextReaderStartElement(void *ctx,xmlChar *fullname,xmlChar **atts)

{
  long lVar1;
  char *pcVar2;
  
  lVar1 = *(long *)((long)ctx + 0x1a8);
  if (lVar1 != 0) {
    if (*(code **)(lVar1 + 0x38) != (code *)0x0) {
      (**(code **)(lVar1 + 0x38))();
      if ((((*(long *)((long)ctx + 0x50) != 0) && (*(long *)((long)ctx + 0x38) != 0)) &&
          (pcVar2 = *(char **)(*(long *)((long)ctx + 0x38) + 0x20), pcVar2 != (char *)0x0)) &&
         ((*pcVar2 == '/' && (pcVar2[1] == '>')))) {
        *(undefined2 *)(*(long *)((long)ctx + 0x50) + 0x72) = 1;
      }
    }
    *(undefined4 *)(lVar1 + 0x18) = 1;
  }
  return;
}

Assistant:

static void
xmlTextReaderStartElement(void *ctx, const xmlChar *fullname,
	                  const xmlChar **atts) {
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlTextReaderPtr reader = ctxt->_private;

    if ((reader != NULL) && (reader->startElement != NULL)) {
	reader->startElement(ctx, fullname, atts);
	if ((ctxt->node != NULL) && (ctxt->input != NULL) &&
	    (ctxt->input->cur != NULL) && (ctxt->input->cur[0] == '/') &&
	    (ctxt->input->cur[1] == '>'))
	    ctxt->node->extra = NODE_IS_EMPTY;
    }
    if (reader != NULL)
	reader->state = XML_TEXTREADER_ELEMENT;
}